

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O1

ztresult_t savehandler_startstruct(char *name,void *opaque)

{
  long lVar1;
  ztresult_t zVar2;
  long lVar3;
  bool bVar4;
  savestack_entry_t entry;
  savestack_entry_t local_2c;
  
  lVar1 = *(long *)((long)opaque + 0x10);
  if ((int)((ulong)(lVar1 - *(long *)((long)opaque + 0x18)) >> 2) * -0x55555555 == 0) {
    bVar4 = true;
    lVar3 = 0;
  }
  else {
    lVar3 = lVar1 + -0xc;
    bVar4 = *(int *)(lVar1 + -0xc) != 1;
  }
  local_2c.container = Struct;
  local_2c.nelems = -1;
  local_2c.index = 0;
  zVar2 = savestack_push((save_stack_t *)((long)opaque + 0x10),&local_2c);
  if (zVar2 == 0) {
    if (bVar4) {
      emitf((savestate_t *)opaque,"%s = {\n",name);
    }
    else {
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      emitf((savestate_t *)opaque,"{\n");
    }
    *(int *)((long)opaque + 0xc) = *(int *)((long)opaque + 0xc) + 1;
    zVar2 = 0;
  }
  return zVar2;
}

Assistant:

static ztresult_t savehandler_startstruct(const char *name, void *opaque)
{
  ztresult_t         rc;
  savestate_t       *state   = opaque;
  savestack_entry_t *scope   = NULL;
  int                isarray = 0;
  savestack_entry_t  entry;

  if (!savestack_empty(&state->stack))
  {
    scope   = savestack_top(&state->stack);
    isarray = (scope->container == Array);
  }

  entry.container = Struct;
  entry.nelems    = -1;
  entry.index     = 0;
  rc = savestack_push(&state->stack, &entry);
  if (rc)
    return rc;

  if (isarray)
  {
    scope->index++;
    emitf(state, "{\n");
  }
  else
  {
    emitf(state, "%s = {\n", name);
  }

  indent(state);

  return ztresult_OK;
}